

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O3

SpatialForceVector * __thiscall
iDynTree::SpatialInertia::multiply(SpatialInertia *this,SpatialMotionVector *op)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  SpatialForceVector *ret;
  SpatialForceVector *in_RDI;
  
  in_RDI->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_0015ec98;
  dVar1 = (op->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
          [0];
  dVar2 = this->m_mass;
  dVar3 = this->m_mcom[0];
  dVar7 = this->m_mcom[1];
  dVar8 = this->m_mcom[2];
  dVar9 = (op->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
          [1];
  dVar10 = (op->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
           [2];
  dVar11 = (op->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
           [0];
  dVar12 = (op->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
           [1];
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[0] =
       dVar2 * dVar11 - (dVar10 * dVar7 - dVar9 * dVar8);
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[1] =
       dVar2 * dVar12 - (dVar1 * dVar8 - dVar10 * dVar3);
  dVar4 = (op->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
          [2];
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[2] =
       dVar2 * dVar4 - (dVar3 * dVar9 - dVar1 * dVar7);
  dVar2 = (this->m_rotInertia).super_Matrix3x3.m_data[5];
  dVar13 = (this->m_rotInertia).super_Matrix3x3.m_data[1];
  dVar14 = (this->m_rotInertia).super_Matrix3x3.m_data[4];
  dVar15 = (this->m_rotInertia).super_Matrix3x3.m_data[7];
  dVar5 = (this->m_rotInertia).super_Matrix3x3.m_data[2];
  dVar6 = (this->m_rotInertia).super_Matrix3x3.m_data[8];
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[0] =
       (this->m_rotInertia).super_Matrix3x3.m_data[6] * dVar10 +
       dVar9 * (this->m_rotInertia).super_Matrix3x3.m_data[3] +
       (this->m_rotInertia).super_Matrix3x3.m_data[0] * dVar1 + (dVar4 * dVar7 - dVar12 * dVar8);
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[1] =
       dVar15 * dVar10 + dVar9 * dVar14 + dVar13 * dVar1 + (dVar11 * dVar8 - dVar4 * dVar3);
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[2] =
       dVar10 * dVar6 + dVar2 * dVar9 + dVar1 * dVar5 + (dVar12 * dVar3 - dVar11 * dVar7);
  return in_RDI;
}

Assistant:

SpatialForceVector SpatialInertia::multiply(const SpatialMotionVector& op) const
{
    SpatialForceVector ret;

    // we call this linearForce and angularForce
    // but please remember that they can also be
    // linear and angular momentum
    Eigen::Map<Eigen::Vector3d> linearForce(ret.getLinearVec3().data());
    Eigen::Map<Eigen::Vector3d> angularForce(ret.getAngularVec3().data());
    Eigen::Map<const Eigen::Vector3d> linearMotion(op.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angularMotion(op.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix3d> inertia3d(this->m_rotInertia.data());

    // Implementing the 2.63 formula in Featherstone 2008
    linearForce  = this->m_mass*linearMotion - mcom.cross(angularMotion);
    angularForce = mcom.cross(linearMotion) + inertia3d*(angularMotion);

    return ret;
}